

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetLastItemDataForWindow(ImGuiWindow *window,ImRect *rect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiItemFlags IVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *g;
  uint uVar8;
  
  pIVar7 = GImGui;
  IVar5 = GImGui->CurrentItemFlags;
  fVar1 = (GImGui->IO).MousePos.x;
  fVar2 = (GImGui->Style).TouchExtraPadding.x;
  uVar8 = 0;
  if ((rect->Min).x - fVar2 <= fVar1) {
    fVar3 = (GImGui->IO).MousePos.y;
    fVar4 = (GImGui->Style).TouchExtraPadding.y;
    if (((rect->Min).y - fVar4 <= fVar3) && (fVar1 < fVar2 + (rect->Max).x)) {
      uVar8 = (uint)(fVar3 < (rect->Max).y + fVar4);
    }
  }
  (GImGui->LastItemData).ID = window->MoveId;
  (pIVar7->LastItemData).InFlags = IVar5;
  (pIVar7->LastItemData).StatusFlags = uVar8;
  IVar6 = rect->Max;
  (pIVar7->LastItemData).NavRect.Min = rect->Min;
  (pIVar7->LastItemData).NavRect.Max = IVar6;
  IVar6 = rect->Max;
  (pIVar7->LastItemData).Rect.Min = rect->Min;
  (pIVar7->LastItemData).Rect.Max = IVar6;
  return;
}

Assistant:

static void ImGui::SetLastItemDataForWindow(ImGuiWindow* window, const ImRect& rect)
{
    ImGuiContext& g = *GImGui;
    SetLastItemData(window->MoveId, g.CurrentItemFlags, IsMouseHoveringRect(rect.Min, rect.Max, false) ? ImGuiItemStatusFlags_HoveredRect : 0, rect);
}